

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

bool __thiscall
PDFUsedFont::EnumeratePaths
          (PDFUsedFont *this,IOutlineEnumerator *target,UIntList *inGlyphsList,double inFontSize)

{
  bool bVar1;
  reference puVar2;
  FT_Pos FVar3;
  double adv;
  _Self local_38;
  const_iterator it;
  bool status;
  double inFontSize_local;
  UIntList *inGlyphsList_local;
  IOutlineEnumerator *target_local;
  PDFUsedFont *this_local;
  
  it._M_node._7_1_ = 1;
  IOutlineEnumerator::BeginEnum(target,inFontSize);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(inGlyphsList);
  while( true ) {
    adv = (double)std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end(inGlyphsList)
    ;
    bVar1 = std::operator!=(&local_38,(_Self *)&adv);
    if (!bVar1) break;
    puVar2 = std::_List_const_iterator<unsigned_int>::operator*(&local_38);
    it._M_node._7_1_ =
         FreeTypeFaceWrapper::GetGlyphOutline
                   (&this->mFaceWrapper,*puVar2,&target->super_IOutlineEnumerator);
    if (!(bool)it._M_node._7_1_) break;
    puVar2 = std::_List_const_iterator<unsigned_int>::operator*(&local_38);
    FVar3 = FreeTypeFaceWrapper::GetGlyphWidth(&this->mFaceWrapper,*puVar2);
    IOutlineEnumerator::MoveBasepoint(target,((double)FVar3 * inFontSize) / 1000.0,0.0);
    std::_List_const_iterator<unsigned_int>::operator++(&local_38);
  }
  return (bool)(it._M_node._7_1_ & 1);
}

Assistant:

bool PDFUsedFont::EnumeratePaths(IOutlineEnumerator& target, const UIntList& inGlyphsList,double inFontSize)
{
	bool status = true;
    target.BeginEnum(inFontSize);
	for( UIntList::const_iterator it = inGlyphsList.begin(); it != inGlyphsList.end(); ++it )
    {
		status = mFaceWrapper.GetGlyphOutline(*it, target);
		if (!status) break;

		// Keep track of glyphs' advance
		double adv = mFaceWrapper.GetGlyphWidth(*it);
		target.MoveBasepoint(adv * inFontSize / 1000.0, 0);
    }
	return status;
}